

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EulerAngles.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::EulerAngles::Encode(EulerAngles *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  EulerAngles *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,(float)this->m_f32Psi);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32Theta);
  KDataStream::operator<<(pKVar1,(float)this->m_f32Phi);
  return;
}

Assistant:

void EulerAngles::Encode( KDataStream & stream ) const
{
    stream << m_f32Psi
           << m_f32Theta
           << m_f32Phi;
}